

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

bool __thiscall
xscript::parser::ast::parse_type_declaration
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args_02;
  bool bVar1;
  pointer this_00;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  basic_string_view<char,_std::char_traits<char>_> *local_148;
  undefined8 local_140;
  allocator<char> local_131;
  string local_130;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  basic_string_view<char,_std::char_traits<char>_> *local_100;
  undefined8 local_f8;
  allocator<char> local_e9;
  string local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  basic_string_view<char,_std::char_traits<char>_> *local_b8;
  undefined8 local_b0;
  allocator<char> local_a1;
  string local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> *local_70;
  undefined8 local_68;
  allocator<char> local_49;
  string local_48;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *local_28;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *node;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
  *parent_local;
  ast *this_local;
  
  node = parent;
  parent_local = (unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                  *)this;
  this_00 = std::
            unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>::
            operator->(parent);
  local_28 = ast_node::add_child(this_00,TYPE_DECLARATION);
  bVar1 = tokenizer::token::operator!=(&this->cur_token,TK_TYPE);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"build_O0/src/CMakeFiles/xscript.dir/compiler_depend.ts",
               &local_49);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_80,"\'type\' expected");
    local_68 = 1;
    args_02._M_len = 1;
    args_02._M_array = &local_80;
    local_70 = &local_80;
    this_local._7_1_ = process_failover(this,&local_48,0x392,args_02,true);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  else {
    next(this);
    bVar1 = tokenizer::token::operator!=(&this->cur_token,TK_IDENTIFIER);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"build_O0/src/CMakeFiles/xscript.dir/compiler_depend.ts",
                 &local_a1);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_c8,"<identifier> expected");
      local_b0 = 1;
      args_01._M_len = 1;
      args_01._M_array = &local_c8;
      local_b8 = &local_c8;
      this_local._7_1_ = process_failover(this,&local_a0,0x397,args_01,true);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
    }
    else {
      next(this);
      bVar1 = parse_type_declarator(this,local_28);
      if (bVar1) {
        next(this);
        bVar1 = tokenizer::token::operator!=(&this->cur_token,TK_SEMICOLON);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_130,"build_O0/src/CMakeFiles/xscript.dir/compiler_depend.ts",
                     &local_131);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_158,"\';\' expected after type declaration");
          local_140 = 1;
          args._M_len = 1;
          args._M_array = &local_158;
          local_148 = &local_158;
          this_local._7_1_ = append_syntax_error(this,&local_130,0x3a1,args);
          std::__cxx11::string::~string((string *)&local_130);
          std::allocator<char>::~allocator(&local_131);
        }
        else {
          next(this);
          this_local._7_1_ = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"build_O0/src/CMakeFiles/xscript.dir/compiler_depend.ts",
                   &local_e9);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_110,"<type declarator> expected");
        local_f8 = 1;
        args_00._M_len = 1;
        args_00._M_array = &local_110;
        local_100 = &local_110;
        this_local._7_1_ = process_failover(this,&local_e8,0x39c,args_00,true);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator(&local_e9);
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ast::parse_type_declaration(std::unique_ptr<ast_node>& parent) {
    std::unique_ptr<ast_node>& node = parent->add_child(TYPE_DECLARATION);

    if (cur_token != tokenizer::TK_TYPE) {
        return failover({"'type' expected"});
    }
    next();

    if (cur_token != tokenizer::TK_IDENTIFIER) {
        return failover({"<identifier> expected"});
    }
    next();

    if (!parse_type_declarator(node)) {
        return failover({"<type declarator> expected"});
    }
    next();

    if (cur_token != tokenizer::TK_SEMICOLON) {
        return syntax_error({"';' expected after type declaration"});
    }
    next();

    return true;
}